

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastLut(Gia_Man_t *pNew,word Truth,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vMemory;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Vec_Int_t vLeaves;
  word local_50;
  Gia_Man_t *local_48;
  Vec_Int_t local_40;
  
  local_50 = Truth;
  local_48 = pNew;
  vMemory = (Vec_Int_t *)calloc(1,0x10);
  vRes->nSize = 0;
  local_40.nCap = nFans;
  local_40.nSize = nFans;
  local_40.pArray = pFans;
  if (nOuts != 1) {
    __assert_fail("nOuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x2d8,"void Wlc_BlastLut(Gia_Man_t *, word, int *, int, int, Vec_Int_t *)");
  }
  if (nFans < 6) {
    if (nFans < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    uVar6 = (uint)Truth;
    uVar2 = -(uVar6 & 1);
    if (nFans != 0) {
      uVar2 = uVar6;
    }
    uVar2 = (uVar2 & 3) * 5;
    if (1 < (uint)nFans) {
      uVar2 = uVar6;
    }
    bVar1 = (byte)(uVar2 << 4) | (byte)uVar2 & 0xf;
    if (2 < (uint)nFans) {
      bVar1 = (byte)Truth;
    }
    uVar4 = (ulong)CONCAT11(bVar1,bVar1);
    iVar3 = 3;
    if (3 < (uint)nFans) {
      uVar4 = Truth;
      iVar3 = nFans;
    }
    uVar5 = (ulong)((uint)uVar4 << 0x10 | (uint)uVar4 & 0xffff);
    if (1 < iVar3 - 3U) {
      uVar5 = uVar4;
    }
    local_50 = uVar5 << 0x20 | uVar5 & 0xffffffff;
  }
  iVar3 = Kit_TruthToGia(local_48,(uint *)&local_50,nFans,vMemory,&local_40,1);
  Vec_IntPush(vRes,iVar3);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  return;
}

Assistant:

void Wlc_BlastLut( Gia_Man_t * pNew, word Truth, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    int iLit;
    Vec_IntClear( vRes );
    assert( nOuts == 1 );
    if ( nFans < 6 )
        Truth = Abc_Tt6Stretch( Truth, nFans );
    iLit = Kit_TruthToGia( pNew, (unsigned *)&Truth, nFans, vMemory, &vLeaves, 1 );
    Vec_IntPush( vRes, iLit );
    Vec_IntFree( vMemory );
}